

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLinking.cpp
# Opt level: O2

IterateResult __thiscall
glcts::GeometryShaderIncompleteGSTest::iterate(GeometryShaderIncompleteGSTest *this)

{
  ostringstream *poVar1;
  pointer p_Var2;
  int iVar3;
  GLuint GVar4;
  deUint32 dVar5;
  undefined4 extraout_var;
  NotSupportedError *this_00;
  _run *current_run;
  qpTestResult testResult;
  char *pcVar7;
  TestContext *this_01;
  uint uVar8;
  bool has_vs_compiled;
  bool has_fs_compiled;
  bool local_1b9;
  uint local_1b8;
  GLint link_status;
  undefined1 local_1b0 [384];
  long lVar6;
  
  if ((this->super_TestCaseBase).m_is_geometry_shader_extension_supported == false) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"Geometry shader functionality not supported, skipping",
               fixed_sample_locations_values + 1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLinking.cpp"
               ,0x1c4);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  initTestRuns(this);
  iVar3 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar3);
  local_1b8 = (uint)CONCAT71((int7)((ulong)lVar6 >> 8),1);
  poVar1 = (ostringstream *)(local_1b0 + 8);
  uVar8 = 0;
  do {
    p_Var2 = (this->m_test_runs).
             super__Vector_base<glcts::GeometryShaderIncompleteGSTest::_run,_std::allocator<glcts::GeometryShaderIncompleteGSTest::_run>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->m_test_runs).
                       super__Vector_base<glcts::GeometryShaderIncompleteGSTest::_run,_std::allocator<glcts::GeometryShaderIncompleteGSTest::_run>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)p_Var2) / 3) <=
        (ulong)uVar8) {
      if ((local_1b8 & 1) == 0) {
LAB_00ce9a03:
        this_01 = (this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx;
        pcVar7 = "Fail";
        testResult = QP_TEST_RESULT_FAIL;
      }
      else {
        this_01 = (this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx;
        pcVar7 = "Pass";
        testResult = QP_TEST_RESULT_PASS;
      }
      tcu::TestContext::setTestResult(this_01,testResult,pcVar7);
      return STOP;
    }
    current_run = p_Var2 + uVar8;
    deinitSOs(this);
    has_fs_compiled = false;
    has_vs_compiled = false;
    initShaderObjects(this,current_run,&has_fs_compiled,&local_1b9,&has_vs_compiled);
    if ((has_fs_compiled != true) || (has_vs_compiled == false)) {
      local_1b0._0_8_ = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      poVar1 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,"Dummy FS and/or dummy VS failed to compile");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      goto LAB_00ce9a03;
    }
    GVar4 = (**(code **)(lVar6 + 0x3c8))();
    this->m_po_id = GVar4;
    dVar5 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar5,"glCreateProgram() call failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLinking.cpp"
                    ,0x1e6);
    (**(code **)(lVar6 + 0x10))(this->m_po_id,this->m_fs_id);
    (**(code **)(lVar6 + 0x10))(this->m_po_id,this->m_gs_id);
    (**(code **)(lVar6 + 0x10))(this->m_po_id,this->m_vs_id);
    dVar5 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar5,"glAttachShader() call(s) failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLinking.cpp"
                    ,0x1ec);
    (**(code **)(lVar6 + 0xce8))(this->m_po_id);
    dVar5 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar5,"glLinkProgram() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLinking.cpp"
                    ,0x1f0);
    link_status = 0;
    (**(code **)(lVar6 + 0x9d8))(this->m_po_id,0x8b82,&link_status);
    dVar5 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar5,"glGetProgramiv() call failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLinking.cpp"
                    ,0x1f6);
    if (link_status == 1) {
      local_1b0._0_8_ = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,
                      "PO with a malformed Geometry Shader was linked successfully.");
      std::operator<<((ostream *)poVar1," [input primitive type]:");
      pcVar7 = "NOT DEFINED";
      if (current_run->is_input_primitive_type_defined != false) {
        pcVar7 = "DEFINED";
      }
      std::operator<<((ostream *)poVar1,pcVar7);
      std::operator<<((ostream *)poVar1," [output primitive type]:");
      pcVar7 = "NOT DEFINED";
      if (current_run->is_output_primitive_type_defined != false) {
        pcVar7 = "DEFINED";
      }
      std::operator<<((ostream *)poVar1,pcVar7);
      std::operator<<((ostream *)poVar1," [max_vertices]:");
      pcVar7 = "NOT DEFINED";
      if (current_run->is_max_vertices_defined != false) {
        pcVar7 = "DEFINED";
      }
      std::operator<<((ostream *)poVar1,pcVar7);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      local_1b8 = 0;
    }
    (**(code **)(lVar6 + 0x448))(this->m_po_id);
    dVar5 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar5,"glDeleteProgram() call failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLinking.cpp"
                    ,0x209);
    uVar8 = uVar8 + 1;
  } while( true );
}

Assistant:

tcu::TestNode::IterateResult GeometryShaderIncompleteGSTest::iterate()
{
	bool result = true;

	/* This test should only run if EXT_geometry_shader is supported. */
	if (!m_is_geometry_shader_extension_supported)
	{
		throw tcu::NotSupportedError(GEOMETRY_SHADER_EXTENSION_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	/* Initialize test runs */
	initTestRuns();

	/* Iterate over the test run set */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	for (unsigned int run_index = 0; run_index < m_test_runs.size(); ++run_index)
	{
		const _run& current_run = m_test_runs[run_index];

		/* Release shader objects initialized in previous iterations */
		deinitSOs();

		/* Set up shader objects */
		bool has_fs_compiled = false;
		bool has_gs_compiled = false;
		bool has_vs_compiled = false;

		initShaderObjects(current_run, &has_fs_compiled, &has_gs_compiled, &has_vs_compiled);

		if (!has_fs_compiled || !has_vs_compiled)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Dummy FS and/or dummy VS failed to compile"
							   << tcu::TestLog::EndMessage;

			result = false;
			break;
		}

		/* Set up a program object */
		m_po_id = gl.createProgram();
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateProgram() call failed");

		gl.attachShader(m_po_id, m_fs_id);
		gl.attachShader(m_po_id, m_gs_id);
		gl.attachShader(m_po_id, m_vs_id);

		GLU_EXPECT_NO_ERROR(gl.getError(), "glAttachShader() call(s) failed");

		/* Try to link the PO */
		gl.linkProgram(m_po_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glLinkProgram() call failed.");

		/* Verify the link status */
		glw::GLint link_status = GL_FALSE;

		gl.getProgramiv(m_po_id, GL_LINK_STATUS, &link_status);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramiv() call failed");

		if (link_status == GL_TRUE)
		{
			m_testCtx.getLog() << tcu::TestLog::Message
							   << "PO with a malformed Geometry Shader was linked successfully."
							   << " [input primitive type]:"
							   << ((current_run.is_input_primitive_type_defined) ? "DEFINED" : "NOT DEFINED")
							   << " [output primitive type]:"
							   << ((current_run.is_output_primitive_type_defined) ? "DEFINED" : "NOT DEFINED")
							   << " [max_vertices]:"
							   << ((current_run.is_max_vertices_defined) ? "DEFINED" : "NOT DEFINED")
							   << tcu::TestLog::EndMessage;

			result = false;
		}

		/* Clean up for the next iteration */
		gl.deleteProgram(m_po_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glDeleteProgram() call failed");
	} /* for (all test runs) */

	if (result)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	return STOP;
}